

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase_p.h
# Opt level: O0

void __thiscall QtFontFamily::QtFontFamily(QtFontFamily *this,QString *n)

{
  QString *in_RSI;
  QString *in_RDI;
  
  *(byte *)&(in_RDI->d).d = *(byte *)&(in_RDI->d).d & 0xfe;
  *(byte *)&(in_RDI->d).d = *(byte *)&(in_RDI->d).d & 0xfd;
  *(byte *)&(in_RDI->d).d = *(byte *)&(in_RDI->d).d & 0xfb;
  QString::QString(in_RSI,in_RDI);
  QList<QString>::QList((QList<QString> *)0x74ad5e);
  *(undefined4 *)&in_RDI[2].d.ptr = 0;
  in_RDI[2].d.size = 0;
  memset(in_RDI + 3,0,0x22);
  return;
}

Assistant:

QtFontFamily(const QString &n)
        :
        populated(false),
        fixedPitch(false),
        colorFont(false),
        name(n), count(0), foundries(nullptr)
    {
        memset(writingSystems, 0, sizeof(writingSystems));
    }